

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_relaxng(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  FILE *pFVar8;
  xmlDocPtr pxVar9;
  undefined8 uVar10;
  xmlDocPtr pxVar11;
  xmlDocPtr pxVar12;
  int nr;
  int nr_00;
  int nr_01;
  int nr_02;
  int nr_03;
  int nr_04;
  int nr_05;
  int nr_06;
  int n_output;
  int iVar13;
  xmlDocPtr in_RSI;
  int test_ret;
  ulong uVar14;
  int test_ret_1;
  undefined8 *puVar15;
  bool bVar16;
  char *pcVar17;
  int n_doc;
  int local_44;
  int local_40;
  int test_ret_3;
  int test_ret_2;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing relaxng : 14 of 25 functions ...");
  }
  iVar13 = 0;
  local_40 = 0;
  do {
    if (iVar13 == 2) {
      function_tests = function_tests + 1;
      iVar13 = 0;
      local_44 = 0;
      do {
        if (iVar13 == 2) {
          function_tests = function_tests + 1;
          iVar13 = 0;
          bVar16 = true;
          do {
            if (!bVar16) {
              function_tests = function_tests + 1;
              iVar1 = 0;
              bVar16 = true;
              do {
                if (!bVar16) {
                  local_44 = local_44 + local_40;
                  function_tests = function_tests + 1;
                  iVar2 = xmlMemBlocks();
                  xmlRelaxNGInitTypes();
                  call_tests = call_tests + 1;
                  xmlResetLastError();
                  iVar3 = xmlMemBlocks();
                  if (iVar2 != iVar3) {
                    iVar4 = xmlMemBlocks();
                    in_RSI = (xmlDocPtr)(ulong)(uint)(iVar4 - iVar2);
                    printf("Leak of %d blocks found in xmlRelaxNGInitTypes");
                    putchar(10);
                  }
                  test_ret_3 = (int)(iVar2 != iVar3);
                  function_tests = function_tests + 1;
                  test_ret_2 = 0;
                  pxVar11 = (xmlDocPtr)0x0;
                  while (iVar2 = (int)pxVar11, iVar2 != 4) {
                    iVar3 = xmlMemBlocks();
                    pxVar9 = gen_xmlDocPtr(iVar2,(int)in_RSI);
                    uVar10 = xmlRelaxNGNewDocParserCtxt(pxVar9);
                    xmlRelaxNGFreeParserCtxt(uVar10);
                    call_tests = call_tests + 1;
                    des_xmlDocPtr((int)pxVar9,in_RSI,nr);
                    xmlResetLastError();
                    iVar4 = xmlMemBlocks();
                    if (iVar3 != iVar4) {
                      iVar4 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlRelaxNGNewDocParserCtxt",
                             (ulong)(uint)(iVar4 - iVar3));
                      test_ret_2 = test_ret_2 + 1;
                      printf(" %d");
                      putchar(10);
                      in_RSI = pxVar11;
                    }
                    pxVar11 = (xmlDocPtr)(ulong)(iVar2 + 1);
                  }
                  function_tests = function_tests + 1;
                  local_40 = 0;
                  uVar14 = 0;
                  while (iVar2 = (int)uVar14, iVar2 != 4) {
                    pxVar11 = (xmlDocPtr)0x0;
                    while( true ) {
                      iVar3 = (int)in_RSI;
                      iVar4 = (int)pxVar11;
                      if (iVar4 == 4) break;
                      iVar5 = xmlMemBlocks();
                      if (iVar2 == 0) {
                        bVar16 = false;
                        pcVar17 = "foo";
                      }
                      else if (iVar2 == 2) {
                        bVar16 = false;
                        pcVar17 = "test/ent2";
                      }
                      else if (iVar2 == 1) {
                        bVar16 = false;
                        pcVar17 = "<foo/>";
                      }
                      else {
                        bVar16 = true;
                        pcVar17 = (char *)0x0;
                      }
                      uVar6 = gen_int(iVar4,iVar3);
                      if ((!bVar16) && (iVar3 = xmlStrlen(pcVar17), iVar3 < (int)uVar6)) {
                        uVar6 = 0;
                      }
                      in_RSI = (xmlDocPtr)(ulong)uVar6;
                      xmlRelaxNGNewMemParserCtxt(pcVar17);
                      xmlRelaxNGFreeParserCtxt();
                      call_tests = call_tests + 1;
                      xmlResetLastError();
                      iVar3 = xmlMemBlocks();
                      if (iVar5 != iVar3) {
                        iVar3 = xmlMemBlocks();
                        printf("Leak of %d blocks found in xmlRelaxNGNewMemParserCtxt",
                               (ulong)(uint)(iVar3 - iVar5));
                        local_40 = local_40 + 1;
                        printf(" %d",uVar14);
                        printf(" %d");
                        putchar(10);
                        in_RSI = pxVar11;
                      }
                      pxVar11 = (xmlDocPtr)(ulong)(iVar4 + 1);
                    }
                    uVar14 = (ulong)(iVar2 + 1);
                  }
                  function_tests = function_tests + 1;
                  iVar13 = local_44 + iVar13 + iVar1 + test_ret_3;
                  puVar15 = &DAT_00159d68;
                  local_34 = 0;
                  for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
                    iVar1 = xmlMemBlocks();
                    if (uVar6 < 3) {
                      uVar10 = *puVar15;
                    }
                    else {
                      uVar10 = 0;
                    }
                    xmlRelaxNGNewParserCtxt(uVar10);
                    xmlRelaxNGFreeParserCtxt();
                    call_tests = call_tests + 1;
                    xmlResetLastError();
                    iVar2 = xmlMemBlocks();
                    if (iVar1 != iVar2) {
                      iVar2 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlRelaxNGNewParserCtxt",
                             (ulong)(uint)(iVar2 - iVar1));
                      local_34 = local_34 + 1;
                      in_RSI = (xmlDocPtr)(ulong)uVar6;
                      printf(" %d");
                      putchar(10);
                    }
                    puVar15 = puVar15 + 1;
                  }
                  function_tests = function_tests + 1;
                  bVar16 = true;
                  test_ret_3 = 0;
                  while (bVar16) {
                    for (uVar6 = 0; iVar1 = (int)in_RSI, uVar6 != 4; uVar6 = uVar6 + 1) {
                      iVar2 = xmlMemBlocks();
                      pxVar11 = gen_xmlDocPtr(uVar6,iVar1);
                      in_RSI = pxVar11;
                      xmlRelaxNGValidateDoc(0);
                      call_tests = call_tests + 1;
                      des_xmlDocPtr((int)pxVar11,in_RSI,nr_00);
                      xmlResetLastError();
                      iVar1 = xmlMemBlocks();
                      if (iVar2 != iVar1) {
                        iVar1 = xmlMemBlocks();
                        printf("Leak of %d blocks found in xmlRelaxNGValidateDoc",
                               (ulong)(uint)(iVar1 - iVar2));
                        test_ret_3 = test_ret_3 + 1;
                        printf(" %d",0);
                        in_RSI = (xmlDocPtr)(ulong)uVar6;
                        printf(" %d");
                        putchar(10);
                      }
                    }
                    bVar16 = false;
                  }
                  iVar13 = iVar13 + test_ret_2 + local_40;
                  function_tests = function_tests + 1;
                  pxVar11 = (xmlDocPtr)0x1;
                  local_40 = 0;
                  while (pxVar11 != (xmlDocPtr)0x0) {
                    uVar14 = 0;
                    while( true ) {
                      pxVar11 = (xmlDocPtr)0x0;
                      iVar1 = (int)uVar14;
                      if (iVar1 == 4) break;
                      while( true ) {
                        iVar2 = (int)in_RSI;
                        iVar3 = (int)pxVar11;
                        if (iVar3 == 3) break;
                        iVar4 = xmlMemBlocks();
                        pxVar12 = gen_xmlDocPtr(iVar1,iVar2);
                        in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar3,iVar2);
                        pxVar9 = pxVar12;
                        xmlRelaxNGValidateFullElement(0,pxVar12,in_RSI);
                        call_tests = call_tests + 1;
                        des_xmlDocPtr((int)pxVar12,pxVar9,nr_01);
                        des_xmlNodePtr(iVar3,(xmlNodePtr)in_RSI,nr_02);
                        xmlResetLastError();
                        iVar2 = xmlMemBlocks();
                        if (iVar4 != iVar2) {
                          iVar2 = xmlMemBlocks();
                          printf("Leak of %d blocks found in xmlRelaxNGValidateFullElement",
                                 (ulong)(uint)(iVar2 - iVar4));
                          local_40 = local_40 + 1;
                          printf(" %d",0);
                          printf(" %d",uVar14);
                          printf(" %d");
                          putchar(10);
                          in_RSI = pxVar11;
                        }
                        pxVar11 = (xmlDocPtr)(ulong)(iVar3 + 1);
                      }
                      uVar14 = (ulong)(iVar1 + 1);
                    }
                  }
                  function_tests = function_tests + 1;
                  pxVar11 = (xmlDocPtr)0x1;
                  test_ret_2 = 0;
                  while (pxVar11 != (xmlDocPtr)0x0) {
                    uVar14 = 0;
                    while( true ) {
                      pxVar11 = (xmlDocPtr)0x0;
                      iVar1 = (int)uVar14;
                      if (iVar1 == 4) break;
                      while( true ) {
                        iVar2 = (int)in_RSI;
                        iVar3 = (int)pxVar11;
                        if (iVar3 == 3) break;
                        iVar4 = xmlMemBlocks();
                        pxVar12 = gen_xmlDocPtr(iVar1,iVar2);
                        in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar3,iVar2);
                        pxVar9 = pxVar12;
                        xmlRelaxNGValidatePopElement(0,pxVar12,in_RSI);
                        call_tests = call_tests + 1;
                        des_xmlDocPtr((int)pxVar12,pxVar9,nr_03);
                        des_xmlNodePtr(iVar3,(xmlNodePtr)in_RSI,nr_04);
                        xmlResetLastError();
                        iVar2 = xmlMemBlocks();
                        if (iVar4 != iVar2) {
                          iVar2 = xmlMemBlocks();
                          printf("Leak of %d blocks found in xmlRelaxNGValidatePopElement",
                                 (ulong)(uint)(iVar2 - iVar4));
                          test_ret_2 = test_ret_2 + 1;
                          printf(" %d",0);
                          printf(" %d",uVar14);
                          printf(" %d");
                          putchar(10);
                          in_RSI = pxVar11;
                        }
                        pxVar11 = (xmlDocPtr)(ulong)(iVar3 + 1);
                      }
                      uVar14 = (ulong)(iVar1 + 1);
                    }
                  }
                  function_tests = function_tests + 1;
                  iVar13 = iVar13 + local_34 + test_ret_3;
                  pxVar11 = (xmlDocPtr)0x1;
                  test_ret_3 = 0;
                  while (pxVar11 != (xmlDocPtr)0x0) {
                    uVar14 = 0;
                    while( true ) {
                      pxVar11 = (xmlDocPtr)0x0;
                      iVar1 = (int)uVar14;
                      if (iVar1 == 5) break;
                      while( true ) {
                        iVar2 = (int)in_RSI;
                        iVar3 = (int)pxVar11;
                        if (iVar3 == 4) break;
                        iVar4 = xmlMemBlocks();
                        in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar1,iVar2);
                        iVar2 = gen_int(iVar3,iVar2);
                        if ((in_RSI != (xmlDocPtr)0x0) && (iVar5 = xmlStrlen(in_RSI), iVar5 < iVar2)
                           ) {
                          iVar2 = 0;
                        }
                        xmlRelaxNGValidatePushCData(0,in_RSI,iVar2);
                        call_tests = call_tests + 1;
                        xmlResetLastError();
                        iVar2 = xmlMemBlocks();
                        if (iVar4 != iVar2) {
                          iVar2 = xmlMemBlocks();
                          printf("Leak of %d blocks found in xmlRelaxNGValidatePushCData",
                                 (ulong)(uint)(iVar2 - iVar4));
                          test_ret_3 = test_ret_3 + 1;
                          printf(" %d",0);
                          printf(" %d",uVar14);
                          printf(" %d");
                          putchar(10);
                          in_RSI = pxVar11;
                        }
                        pxVar11 = (xmlDocPtr)(ulong)(iVar3 + 1);
                      }
                      uVar14 = (ulong)(iVar1 + 1);
                    }
                  }
                  iVar13 = iVar13 + local_40;
                  function_tests = function_tests + 1;
                  pxVar11 = (xmlDocPtr)0x1;
                  local_40 = 0;
                  while (pxVar11 != (xmlDocPtr)0x0) {
                    uVar14 = 0;
                    while( true ) {
                      pxVar11 = (xmlDocPtr)0x0;
                      iVar1 = (int)uVar14;
                      if (iVar1 == 4) break;
                      while( true ) {
                        iVar2 = (int)in_RSI;
                        iVar3 = (int)pxVar11;
                        if (iVar3 == 3) break;
                        iVar4 = xmlMemBlocks();
                        pxVar12 = gen_xmlDocPtr(iVar1,iVar2);
                        in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar3,iVar2);
                        pxVar9 = pxVar12;
                        xmlRelaxNGValidatePushElement(0,pxVar12,in_RSI);
                        call_tests = call_tests + 1;
                        des_xmlDocPtr((int)pxVar12,pxVar9,nr_05);
                        des_xmlNodePtr(iVar3,(xmlNodePtr)in_RSI,nr_06);
                        xmlResetLastError();
                        iVar2 = xmlMemBlocks();
                        if (iVar4 != iVar2) {
                          iVar2 = xmlMemBlocks();
                          printf("Leak of %d blocks found in xmlRelaxNGValidatePushElement",
                                 (ulong)(uint)(iVar2 - iVar4));
                          local_40 = local_40 + 1;
                          printf(" %d",0);
                          printf(" %d",uVar14);
                          printf(" %d");
                          putchar(10);
                          in_RSI = pxVar11;
                        }
                        pxVar11 = (xmlDocPtr)(ulong)(iVar3 + 1);
                      }
                      uVar14 = (ulong)(iVar1 + 1);
                    }
                  }
                  function_tests = function_tests + 1;
                  bVar16 = true;
                  iVar1 = 0;
                  while (bVar16) {
                    for (uVar6 = 0; iVar2 = (int)in_RSI, uVar6 != 4; uVar6 = uVar6 + 1) {
                      iVar3 = xmlMemBlocks();
                      uVar7 = gen_int(uVar6,iVar2);
                      in_RSI = (xmlDocPtr)(ulong)uVar7;
                      xmlRelaxParserSetFlag(0);
                      call_tests = call_tests + 1;
                      xmlResetLastError();
                      iVar2 = xmlMemBlocks();
                      if (iVar3 != iVar2) {
                        iVar2 = xmlMemBlocks();
                        printf("Leak of %d blocks found in xmlRelaxParserSetFlag",
                               (ulong)(uint)(iVar2 - iVar3));
                        iVar1 = iVar1 + 1;
                        printf(" %d",0);
                        in_RSI = (xmlDocPtr)(ulong)uVar6;
                        printf(" %d");
                        putchar(10);
                      }
                    }
                    bVar16 = false;
                  }
                  function_tests = function_tests + 1;
                  uVar6 = iVar13 + test_ret_2 + test_ret_3 + local_40 + iVar1;
                  if (uVar6 != 0) {
                    printf("Module relaxng: %d errors\n",(ulong)uVar6);
                  }
                  return uVar6;
                }
                bVar16 = true;
                while (bVar16) {
                  bVar16 = true;
LAB_00129a34:
                  if (bVar16) {
                    bVar16 = true;
                    while (bVar16) {
                      iVar2 = xmlMemBlocks();
                      bVar16 = false;
                      in_RSI = (xmlDocPtr)0x0;
                      xmlRelaxNGGetValidErrors(0,0,0,0);
                      call_tests = call_tests + 1;
                      xmlResetLastError();
                      iVar3 = xmlMemBlocks();
                      if (iVar2 == iVar3) goto LAB_00129a34;
                      xmlMemBlocks();
                      bVar16 = false;
                      printf("Leak of %d blocks found in xmlRelaxNGGetValidErrors");
                      iVar1 = iVar1 + 1;
                      printf(" %d");
                      printf(" %d");
                      printf(" %d");
                      in_RSI = (xmlDocPtr)0x0;
                      printf(" %d");
                      putchar(10);
                    }
                    bVar16 = false;
                    goto LAB_00129a34;
                  }
                  bVar16 = false;
                }
                bVar16 = false;
              } while( true );
            }
            bVar16 = true;
            while (bVar16) {
              bVar16 = true;
LAB_00129964:
              if (bVar16) {
                bVar16 = true;
                while (bVar16) {
                  iVar1 = xmlMemBlocks();
                  bVar16 = false;
                  in_RSI = (xmlDocPtr)0x0;
                  xmlRelaxNGGetParserErrors(0,0,0);
                  call_tests = call_tests + 1;
                  xmlResetLastError();
                  iVar2 = xmlMemBlocks();
                  if (iVar1 == iVar2) goto LAB_00129964;
                  xmlMemBlocks();
                  bVar16 = false;
                  printf("Leak of %d blocks found in xmlRelaxNGGetParserErrors");
                  iVar13 = iVar13 + 1;
                  printf(" %d");
                  printf(" %d");
                  printf(" %d");
                  in_RSI = (xmlDocPtr)0x0;
                  printf(" %d");
                  putchar(10);
                }
                bVar16 = false;
                goto LAB_00129964;
              }
              bVar16 = false;
            }
            bVar16 = false;
          } while( true );
        }
        bVar16 = true;
        while (bVar16) {
          iVar1 = xmlMemBlocks();
          pFVar8 = (FILE *)gen_FILE_ptr(iVar13,(int)in_RSI);
          in_RSI = (xmlDocPtr)0x0;
          xmlRelaxNGDumpTree();
          call_tests = call_tests + 1;
          if (pFVar8 != (FILE *)0x0) {
            fclose(pFVar8);
          }
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 == iVar2) break;
          iVar2 = xmlMemBlocks();
          bVar16 = false;
          printf("Leak of %d blocks found in xmlRelaxNGDumpTree",(ulong)(uint)(iVar2 - iVar1));
          local_44 = local_44 + 1;
          printf(" %d");
          in_RSI = (xmlDocPtr)0x0;
          printf(" %d");
          putchar(10);
        }
        iVar13 = iVar13 + 1;
      } while( true );
    }
    bVar16 = true;
    while (bVar16) {
      iVar1 = xmlMemBlocks();
      pFVar8 = (FILE *)gen_FILE_ptr(iVar13,(int)in_RSI);
      in_RSI = (xmlDocPtr)0x0;
      xmlRelaxNGDump();
      call_tests = call_tests + 1;
      if (pFVar8 != (FILE *)0x0) {
        fclose(pFVar8);
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 == iVar2) break;
      iVar2 = xmlMemBlocks();
      bVar16 = false;
      printf("Leak of %d blocks found in xmlRelaxNGDump",(ulong)(uint)(iVar2 - iVar1));
      local_40 = local_40 + 1;
      printf(" %d");
      in_RSI = (xmlDocPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar13 = iVar13 + 1;
  } while( true );
}

Assistant:

static int
test_relaxng(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing relaxng : 14 of 25 functions ...\n");
    test_ret += test_xmlRelaxNGDump();
    test_ret += test_xmlRelaxNGDumpTree();
    test_ret += test_xmlRelaxNGGetParserErrors();
    test_ret += test_xmlRelaxNGGetValidErrors();
    test_ret += test_xmlRelaxNGInitTypes();
    test_ret += test_xmlRelaxNGNewDocParserCtxt();
    test_ret += test_xmlRelaxNGNewMemParserCtxt();
    test_ret += test_xmlRelaxNGNewParserCtxt();
    test_ret += test_xmlRelaxNGNewValidCtxt();
    test_ret += test_xmlRelaxNGParse();
    test_ret += test_xmlRelaxNGSetParserErrors();
    test_ret += test_xmlRelaxNGSetParserStructuredErrors();
    test_ret += test_xmlRelaxNGSetResourceLoader();
    test_ret += test_xmlRelaxNGSetValidErrors();
    test_ret += test_xmlRelaxNGSetValidStructuredErrors();
    test_ret += test_xmlRelaxNGValidateDoc();
    test_ret += test_xmlRelaxNGValidateFullElement();
    test_ret += test_xmlRelaxNGValidatePopElement();
    test_ret += test_xmlRelaxNGValidatePushCData();
    test_ret += test_xmlRelaxNGValidatePushElement();
    test_ret += test_xmlRelaxParserSetFlag();

    if (test_ret != 0)
	printf("Module relaxng: %d errors\n", test_ret);
    return(test_ret);
}